

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O2

void __thiscall db_packer::process(db_packer *this,cl_parser *cl)

{
  uint8_t *puVar1;
  pointer pcVar2;
  size_type sVar3;
  pointer pbVar4;
  db_file *pdVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  xr_file_system *this_00;
  xr_writer *pxVar10;
  xr_reader *this_01;
  size_t sVar11;
  xr_memory_writer *this_02;
  undefined4 extraout_var;
  long lVar12;
  string *psVar13;
  pointer pbVar14;
  pointer ppdVar15;
  size_type sVar16;
  char *pcVar17;
  ulong uVar18;
  uint8_t *data;
  size_t size;
  pointer local_2a0;
  ulong local_298;
  char *userdata;
  string *local_288;
  db_packer *local_280;
  string target;
  string extension;
  xr_scrambler scrambler;
  
  if (cl->m_num_params != 1) {
    xray_re::msg("incorrect number of parameters");
    return;
  }
  lVar12 = 2;
  while (lVar12 = lVar12 + -1, lVar12 != 0) {
    pcVar17 = cl->m_options[cl->m_argc - 1].name;
    bVar6 = xray_re::xr_file_system::folder_exist(pcVar17);
    if (!bVar6) {
      xray_re::msg("can\'t find %s",pcVar17);
      return;
    }
  }
  target._M_dataplus._M_p = (pointer)&target.field_2;
  target._M_string_length = 0;
  target.field_2._M_local_buf[0] = '\0';
  extension._M_dataplus._M_p = (pointer)&extension.field_2;
  extension._M_string_length = 0;
  extension.field_2._M_local_buf[0] = '\0';
  bVar6 = cl_parser::get_string(cl,"-out",&target);
  if (!bVar6) {
    xray_re::msg("unspecifed output file");
    goto LAB_0011f70b;
  }
  xray_re::xr_file_system::split_path
            (target._M_dataplus._M_p,(string *)0x0,(string *)0x0,&extension);
  bVar6 = cl_parser::get_bool(cl,"-11xx");
  pcVar17 = "unsupported DB format";
  if (!bVar6) {
    bVar6 = cl_parser::get_bool(cl,"-2215");
    if (!bVar6) {
      bVar6 = cl_parser::get_bool(cl,"-2945");
      if (!bVar6) {
        bVar6 = cl_parser::get_bool(cl,"-2947ru");
        bVar7 = cl_parser::get_bool(cl,"-2947ww");
        uVar18 = (ulong)((uint)bVar6 * 8 + 0x10);
        if (!bVar7) {
          uVar18 = (ulong)bVar6 << 3;
        }
        bVar6 = cl_parser::get_bool(cl,"-xdb");
        if (bVar6) {
LAB_0011f62c:
          uVar18 = (ulong)((uint)uVar18 | 0x20);
        }
        else {
          bVar6 = db_tools::is_xdb(&extension);
          if (bVar6) goto LAB_0011f62c;
        }
        uVar8 = (uint)uVar18 - 1;
        local_298 = uVar18;
        if (uVar8 < ((uint)uVar18 ^ uVar8)) {
          this_00 = xray_re::xr_file_system::instance();
          pxVar10 = xray_re::xr_file_system::w_open(this_00,&target);
          this->m_archive = pxVar10;
          if (pxVar10 == (xr_writer *)0x0) {
            xray_re::msg("can\'t load %s",target._M_dataplus._M_p);
          }
          else {
            if ((int)local_298 == 0x20) {
              bVar6 = cl_parser::get_string(cl,"-xdb_ud",&userdata);
              if (bVar6) {
                this_01 = xray_re::xr_file_system::r_open(this_00,userdata);
                if (this_01 == (xr_reader *)0x0) {
                  xray_re::msg("can\'t load %s");
                }
                else {
                  xray_re::xr_writer::open_chunk(this->m_archive,0x29a);
                  pxVar10 = this->m_archive;
                  puVar1 = this_01->m_data;
                  sVar11 = xray_re::xr_reader::size(this_01);
                  (*pxVar10->_vptr_xr_writer[2])(pxVar10,puVar1,sVar11);
                  xray_re::xr_writer::close_chunk(this->m_archive);
                  (*this_01->_vptr_xr_reader[1])(this_01);
                }
              }
            }
            xray_re::xr_writer::open_chunk(this->m_archive,0);
            local_2a0 = (pointer)cl->m_num_params;
            psVar13 = &this->m_root;
            local_288 = psVar13;
            local_280 = this;
            for (sVar11 = 0; (pointer)sVar11 != local_2a0; sVar11 = sVar11 + 1) {
              std::__cxx11::string::assign((char *)psVar13);
              pcVar2 = (this->m_root)._M_dataplus._M_p;
              sVar3 = (this->m_root)._M_string_length;
              for (sVar16 = 0; psVar13 = local_288, sVar3 != sVar16; sVar16 = sVar16 + 1) {
                iVar9 = tolower((int)pcVar2[sVar16]);
                pcVar2[sVar16] = (char)iVar9;
              }
              xray_re::xr_file_system::append_path_separator(local_288);
              this = local_280;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&scrambler,"",(allocator<char> *)&data);
              process_folder(this,(string *)&scrambler);
              std::__cxx11::string::~string((string *)&scrambler);
            }
            xray_re::xr_writer::close_chunk(this->m_archive);
            this_02 = (xr_memory_writer *)operator_new(0x2078);
            xray_re::xr_memory_writer::xr_memory_writer(this_02);
            xray_re::msg("folders:");
            pbVar4 = (this->m_folders).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar14 = (this->m_folders).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar4;
                pbVar14 = pbVar14 + 1) {
              scrambler.m_seed =
                   CONCAT22(scrambler.m_seed._2_2_,(short)(int)pbVar14->_M_string_length + 0x10);
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])(this_02,&scrambler,2);
              scrambler.m_seed = 0;
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])(this_02,&scrambler,4);
              scrambler.m_seed = 0;
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])(this_02,&scrambler,4);
              scrambler.m_seed = 0;
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])(this_02,&scrambler,4);
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])
                        (this_02,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length);
              xray_re::msg("  %s",(pbVar14->_M_dataplus)._M_p);
              scrambler.m_seed = 0;
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])(this_02,&scrambler,4);
            }
            xray_re::msg("files: ");
            local_2a0 = (this->m_files).
                        super__Vector_base<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            for (ppdVar15 = (this->m_files).
                            super__Vector_base<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppdVar15 != local_2a0;
                ppdVar15 = ppdVar15 + 1) {
              pdVar5 = *ppdVar15;
              scrambler.m_seed =
                   CONCAT22(scrambler.m_seed._2_2_,
                            (short)(int)(pdVar5->path)._M_string_length + 0x10);
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])(this_02,&scrambler,2);
              scrambler.m_seed = (int)pdVar5->size_real;
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])(this_02,&scrambler,4);
              scrambler.m_seed = (int)pdVar5->size_compressed;
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])(this_02,&scrambler,4);
              scrambler.m_seed = pdVar5->crc;
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])(this_02,&scrambler,4);
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])
                        (this_02,(pdVar5->path)._M_dataplus._M_p,(pdVar5->path)._M_string_length);
              xray_re::msg("  %s",(pdVar5->path)._M_dataplus._M_p);
              scrambler.m_seed = (int)pdVar5->offset;
              (*(this_02->super_xr_writer)._vptr_xr_writer[2])(this_02,&scrambler,4);
            }
            data = (uint8_t *)0x0;
            size = 0;
            puVar1 = (this_02->m_buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar9 = (*(this_02->super_xr_writer)._vptr_xr_writer[4])(this_02);
            xray_re::xr_lzhuf::compress(&data,&size,puVar1,CONCAT44(extraout_var,iVar9));
            (*(this_02->super_xr_writer)._vptr_xr_writer[1])(this_02);
            if ((int)local_298 == 0x10) {
              xray_re::xr_scrambler::init(&scrambler,(EVP_PKEY_CTX *)0x1);
              xray_re::xr_scrambler::encrypt(&scrambler,(char *)data,(int)data);
            }
            else if ((int)local_298 == 8) {
              xray_re::xr_scrambler::init(&scrambler,(EVP_PKEY_CTX *)0x0);
              xray_re::xr_scrambler::encrypt(&scrambler,(char *)data,(int)data);
            }
            xray_re::xr_writer::open_chunk(this->m_archive,0x80000001);
            (*this->m_archive->_vptr_xr_writer[2])(this->m_archive,data,size);
            xray_re::xr_writer::close_chunk(this->m_archive);
            operator_delete(data,1);
            if (this->m_archive != (xr_writer *)0x0) {
              (*this->m_archive->_vptr_xr_writer[1])();
            }
            this->m_archive = (xr_writer *)0x0;
          }
          goto LAB_0011f70b;
        }
        pcVar17 = "unspecified DB format";
      }
    }
  }
  xray_re::msg(pcVar17);
LAB_0011f70b:
  std::__cxx11::string::~string((string *)&extension);
  std::__cxx11::string::~string((string *)&target);
  return;
}

Assistant:

void db_packer::process(const cl_parser& cl)
{
	if (cl.num_params() != 1) {
		msg("incorrect number of parameters");
		return;
	}

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(0);
		if (!xr_file_system::folder_exist(source)) {
			msg("can't find %s", source);
			return;
		}
	}

	std::string target, extension;
	if (!cl.get_string("-out", target)) {
		msg("unspecifed output file");
		return;
	}
	xr_file_system::split_path(target, 0, 0, &extension);

	unsigned version = DB_VERSION_AUTO;
	if (cl.get_bool("-11xx") || cl.get_bool("-2215") || cl.get_bool("-2945")) {
		msg("unsupported DB format");
		return;
	}
	if (cl.get_bool("-2947ru"))
		version |= DB_VERSION_2947RU;
	if (cl.get_bool("-2947ww"))
		version |= DB_VERSION_2947WW;
	if (cl.get_bool("-xdb") || is_xdb(extension))
		version |= DB_VERSION_XDB;
	if (version == DB_VERSION_AUTO || (version & (version - 1)) != 0) {
		msg("unspecified DB format");
		return;
	}

	xr_file_system& fs = xr_file_system::instance();
	m_archive = fs.w_open(target);
	if (m_archive == 0) {
		msg("can't load %s", target.c_str());
		return;
	}

	const char* userdata;
	if (version == DB_VERSION_XDB && cl.get_string("-xdb_ud", userdata)) {
		if (xr_reader* r = fs.r_open(userdata)) {
			m_archive->open_chunk(DB_CHUNK_USERDATA);
			m_archive->w_raw(r->data(), r->size());
			m_archive->close_chunk();
			fs.r_close(r);
		} else {
			msg("can't load %s", userdata);
		}
	}

	m_archive->open_chunk(DB_CHUNK_DATA);
	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		m_root = cl.param(i);
		xr_strlwr(m_root);
		xr_file_system::append_path_separator(m_root);
		process_folder();
	}
	m_archive->close_chunk();

	xr_memory_writer* w = new xr_memory_writer;
	msg("folders:");
	for (std::vector<std::string>::iterator it = m_folders.begin(),
			end = m_folders.end(); it != end; ++it) {
		w->w_size_u16(it->size() + 16);
		w->w_u32(0);
		w->w_u32(0);
		w->w_u32(0);
		w->w_raw(it->data(), it->size());
		msg("  %s", it->c_str());
		w->w_u32(0);
	}
	msg("files: ");
	for (std::vector<db_file*>::iterator it = m_files.begin(),
			end = m_files.end(); it != end; ++it) {
		db_file* file = *it;
		w->w_size_u16(file->path.size() + 16);
		w->w_size_u32(file->size_real);
		w->w_size_u32(file->size_compressed);
		w->w_u32(file->crc);
		w->w_raw(file->path.data(), file->path.size());
		msg("  %s", file->path.c_str());
		w->w_size_u32(file->offset);
	}
	uint8_t* data = 0;
	size_t size = 0;
	xr_lzhuf::compress(data, size, w->data(), w->tell());
	delete w;
	if (version == DB_VERSION_2947RU) {
		xr_scrambler scrambler(xr_scrambler::CC_RU);
		scrambler.encrypt(data, data, size);
	} else if (version == DB_VERSION_2947WW) {
		xr_scrambler scrambler(xr_scrambler::CC_WW);
		scrambler.encrypt(data, data, size);
	}
	m_archive->open_chunk(DB_CHUNK_HEADER|xr_reader::CHUNK_COMPRESSED);
	m_archive->w_raw(data, size);
	m_archive->close_chunk();
	delete data;
	fs.w_close(m_archive);
}